

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

shared_ptr<(anonymous_namespace)::schema> __thiscall
anon_unknown.dwarf_3c5a8::type_schema::make_for_default_
          (type_schema *this,shared_ptr<(anonymous_namespace)::schema> *param_1,root_schema *param_2
          ,vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *param_3,
          json *default_value)

{
  vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
  *this_00;
  schema *this_01;
  pointer p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  json *in_R9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<(anonymous_namespace)::schema> sVar2;
  __allocator_type __a2;
  shared_ptr<(anonymous_namespace)::type_schema> result;
  allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::type_schema,_std::allocator<(anonymous_namespace)::type_schema>,_(__gnu_cxx::_Lock_policy)2>_>
  local_61;
  schema *local_60;
  vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
  *local_58;
  schema *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::type_schema,_std::allocator<(anonymous_namespace)::type_schema>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_40;
  
  local_50 = (schema *)0x0;
  p_Var1 = (pointer)operator_new(0xc0);
  local_40._M_alloc = &local_61;
  *(undefined8 *)
   ((long)&(((schema_loader *)&p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)->
           super__Function_base)._M_functor + 8) = 0x100000001;
  *(undefined ***)
   &(((schema_loader *)&p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)->
    super__Function_base)._M_functor = &PTR___Sp_counted_ptr_inplace_001510e8;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR_make_for_default__00151010;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) =
       (param_1->super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  local_40._M_ptr = p_Var1;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10),
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)(param_1 + 1));
  local_60 = (schema *)&p_Var1->_M_impl;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR_make_for_default__00151138;
  this_00 = (vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
             *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20);
  std::
  vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
  ::vector(this_00,(vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                    *)(param_1 + 2));
  local_58 = this_00;
  std::
  pair<bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::pair((pair<bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x38),
         (pair<bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)&param_1[3].
             super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount);
  std::
  pair<bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::pair((pair<bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x50),
         (pair<bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)(param_1 + 5));
  std::
  vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
  ::vector((vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
            *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x68),
           (vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
            *)&param_1[6].
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount);
  std::shared_ptr<(anonymous_namespace)::schema>::shared_ptr
            ((shared_ptr<(anonymous_namespace)::schema> *)
             ((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x80),param_1 + 8);
  std::shared_ptr<(anonymous_namespace)::schema>::shared_ptr
            ((shared_ptr<(anonymous_namespace)::schema> *)
             ((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x90),param_1 + 9);
  std::shared_ptr<(anonymous_namespace)::schema>::shared_ptr
            ((shared_ptr<(anonymous_namespace)::schema> *)
             ((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0xa0),param_1 + 10);
  this_01 = local_60;
  local_40._M_ptr = (pointer)0x0;
  local_50 = local_60;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::type_schema,_std::allocator<(anonymous_namespace)::type_schema>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_40);
  schema::set_default_value(this_01,in_R9);
  (this->super_schema)._vptr_schema = (_func_int **)this_01;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_schema).root_ = (root_schema *)p_Var1;
  local_50 = (schema *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  sVar2.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_schema;
  return (shared_ptr<(anonymous_namespace)::schema>)
         sVar2.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<schema> make_for_default_(
	    std::shared_ptr<::schema> & /* sch */,
	    root_schema * /* root */,
	    std::vector<nlohmann::json_uri> & /* uris */,
	    nlohmann::json &default_value) const override
	{
		auto result = std::make_shared<type_schema>(*this);
		result->set_default_value(default_value);
		return result;
	}